

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.h
# Opt level: O1

void __thiscall absl::strings_internal::BigUnsigned<4>::SetToZero(BigUnsigned<4> *this)

{
  if (0 < (long)this->size_) {
    memset(this->words_,0,(long)this->size_ << 2);
  }
  this->size_ = 0;
  return;
}

Assistant:

void SetToZero() {
    std::fill_n(words_, size_, 0u);
    size_ = 0;
  }